

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

TestSuite * __thiscall doctest::detail::TestSuite::operator*(TestSuite *this,char *in)

{
  char *in_local;
  TestSuite *this_local;
  
  this->m_test_suite = in;
  this->m_description = (char *)0x0;
  this->m_skip = false;
  this->m_no_breaks = false;
  this->m_no_output = false;
  this->m_may_fail = false;
  this->m_should_fail = false;
  this->m_expected_failures = 0;
  this->m_timeout = 0.0;
  return this;
}

Assistant:

TestSuite& TestSuite::operator*(const char* in) {
        m_test_suite = in;
        // clear state
        m_description       = nullptr;
        m_skip              = false;
        m_no_breaks         = false;
        m_no_output         = false;
        m_may_fail          = false;
        m_should_fail       = false;
        m_expected_failures = 0;
        m_timeout           = 0;
        return *this;
    }